

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::skipNonNullCast
          (OptimizeInstructions *this,Expression **input,Expression *parent)

{
  bool bVar1;
  bool bVar2;
  PassOptions *passOptions;
  RefAs *pRVar3;
  Module *pMVar4;
  Expression **ppEVar5;
  Iterator IVar6;
  undefined1 local_3a0 [8];
  ShallowEffectAnalyzer movingEffects;
  Expression *child;
  undefined1 local_228 [8];
  Iterator __end6;
  undefined1 local_208 [8];
  Iterator __begin6;
  AbstractChildIterator<wasm::ChildIterator> local_1e8;
  AbstractChildIterator<wasm::ChildIterator> *local_1a8;
  ChildIterator *__range6;
  EffectAnalyzer crossedEffects;
  bool seenInput;
  RefAs *as;
  PassOptions *options;
  bool checkedSiblings;
  Expression *parent_local;
  Expression **input_local;
  OptimizeInstructions *this_local;
  
  bVar1 = false;
  passOptions = Pass::getPassOptions((Pass *)this);
  do {
    pRVar3 = Expression::dynCast<wasm::RefAs>(*input);
    if ((pRVar3 == (RefAs *)0x0) || (pRVar3->op != RefAsNonNull)) {
      return;
    }
    if ((!bVar1) && ((passOptions->trapsNeverHappen & 1U) == 0)) {
      crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      pMVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          );
      EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)&__range6,passOptions,pMVar4);
      ChildIterator::ChildIterator((ChildIterator *)&local_1e8,parent);
      local_1a8 = &local_1e8;
      IVar6 = AbstractChildIterator<wasm::ChildIterator>::begin(local_1a8);
      __end6._8_8_ = IVar6.parent;
      __begin6.parent._0_4_ = IVar6.index;
      local_208 = (undefined1  [8])__end6._8_8_;
      IVar6 = AbstractChildIterator<wasm::ChildIterator>::end(local_1a8);
      local_228 = (undefined1  [8])IVar6.parent;
      __end6.parent._0_4_ = IVar6.index;
      while (bVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                               ((Iterator *)local_208,(Iterator *)local_228), bVar2) {
        ppEVar5 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                            ((Iterator *)local_208);
        movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
        _M_node_count = (size_t)*ppEVar5;
        if ((Expression *)
            movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
            _M_node_count == *input) {
          crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        }
        else if ((crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count.
                  _7_1_ & 1) != 0) {
          EffectAnalyzer::walk
                    ((EffectAnalyzer *)&__range6,
                     (Expression *)
                     movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                     super__Rb_tree_header._M_node_count);
        }
        AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_208);
      }
      ChildIterator::~ChildIterator((ChildIterator *)&local_1e8);
      pMVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          );
      ShallowEffectAnalyzer::ShallowEffectAnalyzer
                ((ShallowEffectAnalyzer *)local_3a0,passOptions,pMVar4,*input);
      bVar2 = EffectAnalyzer::invalidates((EffectAnalyzer *)&__range6,(EffectAnalyzer *)local_3a0);
      if (!bVar2) {
        bVar1 = true;
      }
      ShallowEffectAnalyzer::~ShallowEffectAnalyzer((ShallowEffectAnalyzer *)local_3a0);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&__range6);
      if (bVar2) {
        return;
      }
    }
    *input = pRVar3->value;
  } while( true );
}

Assistant:

void skipNonNullCast(Expression*& input, Expression* parent) {
    // Check the other children for the ordering problem only if we find a
    // possible optimization, to avoid wasted work.
    bool checkedSiblings = false;
    auto& options = getPassOptions();
    while (1) {
      if (auto* as = input->dynCast<RefAs>()) {
        if (as->op == RefAsNonNull) {
          // The problem with effect ordering that is described above is not an
          // issue if traps are assumed to never happen anyhow.
          if (!checkedSiblings && !options.trapsNeverHappen) {
            // We need to see if a child with side effects exists after |input|.
            // If there is such a child, it is a problem as mentioned above (it
            // is fine for such a child to appear *before* |input|, as then we
            // wouldn't be reordering effects). Thus, all we need to do is
            // accumulate the effects in children after |input|, as we want to
            // move the trap across those.
            bool seenInput = false;
            EffectAnalyzer crossedEffects(options, *getModule());
            for (auto* child : ChildIterator(parent)) {
              if (child == input) {
                seenInput = true;
              } else if (seenInput) {
                crossedEffects.walk(child);
              }
            }

            // Check if the effects we cross interfere with the effects of the
            // trap we want to move. (We use a shallow effect analyzer since we
            // will only move the ref.as_non_null itself.)
            ShallowEffectAnalyzer movingEffects(options, *getModule(), input);
            if (crossedEffects.invalidates(movingEffects)) {
              return;
            }

            // If we got here, we've checked the siblings and found no problem.
            checkedSiblings = true;
          }
          input = as->value;
          continue;
        }
      }
      break;
    }
  }